

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ossl_shutdown(Curl_cfilter *cf,Curl_easy *data)

{
  long lVar1;
  curl_socket_t readfd0;
  int iVar2;
  ulong error;
  char *pcVar3;
  uint *puVar4;
  int iVar5;
  bool bVar6;
  int local_144;
  char buf [256];
  
  lVar1 = *(long *)((long)cf->ctx + 0x30);
  if ((data->set).ftp_ccc == '\x02') {
    SSL_shutdown(*(SSL **)(lVar1 + 8));
  }
  if (*(long *)(lVar1 + 8) == 0) {
    return 0;
  }
  bVar6 = false;
  local_144 = 0;
  for (iVar5 = -10; (!bVar6 && (iVar5 != 0)); iVar5 = iVar5 + 1) {
    readfd0 = Curl_conn_cf_get_socket(cf,data);
    iVar2 = Curl_socket_check(readfd0,-1,-1,10000);
    if (iVar2 < 1) {
      if (iVar2 == 0) {
        Curl_failf(data,"SSL shutdown timeout");
        bVar6 = true;
      }
      else {
        puVar4 = (uint *)__errno_location();
        Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar4);
        bVar6 = true;
        local_144 = -1;
      }
    }
    else {
      ERR_clear_error();
      iVar2 = SSL_read(*(SSL **)(lVar1 + 8),buf,0x100);
      iVar2 = SSL_get_error(*(SSL **)(lVar1 + 8),iVar2);
      bVar6 = true;
      switch(iVar2) {
      case 0:
      case 6:
        break;
      default:
        error = ERR_get_error();
        if (error == 0) {
          pcVar3 = SSL_ERROR_to_str(iVar2);
        }
        else {
          pcVar3 = ossl_strerror(error,buf,0x100);
        }
        puVar4 = (uint *)__errno_location();
        Curl_failf(data,"OpenSSL SSL_read on shutdown: %s, errno %d",pcVar3,(ulong)*puVar4);
        break;
      case 2:
        if (((data->set).field_0x8bd & 0x10) == 0) {
          bVar6 = false;
        }
        else {
          bVar6 = false;
          pcVar3 = "SSL_ERROR_WANT_READ";
LAB_00147734:
          Curl_infof(data,pcVar3);
        }
        break;
      case 3:
        if (((data->set).field_0x8bd & 0x10) != 0) {
          pcVar3 = "SSL_ERROR_WANT_WRITE";
          goto LAB_00147734;
        }
      }
    }
  }
  if (((data->set).field_0x8bd & 0x10) != 0) {
    iVar5 = SSL_get_shutdown(*(SSL **)(lVar1 + 8));
    if (iVar5 == 3) {
      if (((data->set).field_0x8bd & 0x10) == 0) goto LAB_001477d4;
      pcVar3 = "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN|SSL_RECEIVED__SHUTDOWN";
    }
    else if (iVar5 == 2) {
      if (((data->set).field_0x8bd & 0x10) == 0) goto LAB_001477d4;
      pcVar3 = "SSL_get_shutdown() returned SSL_RECEIVED_SHUTDOWN";
    }
    else {
      if ((iVar5 != 1) || (((data->set).field_0x8bd & 0x10) == 0)) goto LAB_001477d4;
      pcVar3 = "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN";
    }
    Curl_infof(data,pcVar3);
  }
LAB_001477d4:
  SSL_free(*(SSL **)(lVar1 + 8));
  *(undefined8 *)(lVar1 + 8) = 0;
  return local_144;
}

Assistant:

static int ossl_shutdown(struct Curl_cfilter *cf,
                         struct Curl_easy *data)
{
  int retval = 0;
  struct ssl_connect_data *connssl = cf->ctx;
  char buf[256]; /* We will use this for the OpenSSL error buffer, so it has
                    to be at least 256 bytes long. */
  unsigned long sslerror;
  int nread;
  int buffsize;
  int err;
  bool done = FALSE;
  struct ossl_ssl_backend_data *backend =
    (struct ossl_ssl_backend_data *)connssl->backend;
  int loop = 10;

  DEBUGASSERT(backend);

#ifndef CURL_DISABLE_FTP
  /* This has only been tested on the proftpd server, and the mod_tls code
     sends a close notify alert without waiting for a close notify alert in
     response. Thus we wait for a close notify alert from the server, but
     we do not send one. Let's hope other servers do the same... */

  if(data->set.ftp_ccc == CURLFTPSSL_CCC_ACTIVE)
    (void)SSL_shutdown(backend->handle);
#endif

  if(backend->handle) {
    buffsize = (int)sizeof(buf);
    while(!done && loop--) {
      int what = SOCKET_READABLE(Curl_conn_cf_get_socket(cf, data),
                                 SSL_SHUTDOWN_TIMEOUT);
      if(what > 0) {
        ERR_clear_error();

        /* Something to read, let's do it and hope that it is the close
           notify alert from the server */
        nread = SSL_read(backend->handle, buf, buffsize);
        err = SSL_get_error(backend->handle, nread);

        switch(err) {
        case SSL_ERROR_NONE: /* this is not an error */
        case SSL_ERROR_ZERO_RETURN: /* no more data */
          /* This is the expected response. There was no data but only
             the close notify alert */
          done = TRUE;
          break;
        case SSL_ERROR_WANT_READ:
          /* there's data pending, re-invoke SSL_read() */
          infof(data, "SSL_ERROR_WANT_READ");
          break;
        case SSL_ERROR_WANT_WRITE:
          /* SSL wants a write. Really odd. Let's bail out. */
          infof(data, "SSL_ERROR_WANT_WRITE");
          done = TRUE;
          break;
        default:
          /* openssl/ssl.h says "look at error stack/return value/errno" */
          sslerror = ERR_get_error();
          failf(data, OSSL_PACKAGE " SSL_read on shutdown: %s, errno %d",
                (sslerror ?
                 ossl_strerror(sslerror, buf, sizeof(buf)) :
                 SSL_ERROR_to_str(err)),
                SOCKERRNO);
          done = TRUE;
          break;
        }
      }
      else if(0 == what) {
        /* timeout */
        failf(data, "SSL shutdown timeout");
        done = TRUE;
      }
      else {
        /* anything that gets here is fatally bad */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        retval = -1;
        done = TRUE;
      }
    } /* while()-loop for the select() */

    if(data->set.verbose) {
#ifdef HAVE_SSL_GET_SHUTDOWN
      switch(SSL_get_shutdown(backend->handle)) {
      case SSL_SENT_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN");
        break;
      case SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_RECEIVED_SHUTDOWN");
        break;
      case SSL_SENT_SHUTDOWN|SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN|"
              "SSL_RECEIVED__SHUTDOWN");
        break;
      }
#endif
    }

    SSL_free(backend->handle);
    backend->handle = NULL;
  }
  return retval;
}